

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O1

void __thiscall ftxui::ScreenInteractive::Loop(ScreenInteractive *this,Component *component)

{
  ReceiverImpl<ftxui::Event> *pRVar1;
  _Elt_pointer pEVar2;
  _Elt_pointer pEVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  ostream *poVar10;
  _func_void__Any_data_ptr *__tmp_2;
  code *__a;
  allocator_type *__a_00;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters;
  long lVar11;
  int signal;
  ScreenInteractive *pSVar12;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_00;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_01;
  Event event;
  thread event_listener;
  __sighandler_t old_signal_handler;
  _Any_data __tmp;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  ScreenInteractive *local_180;
  ScreenInteractive *local_170;
  undefined1 local_168 [8];
  undefined1 local_160 [24];
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_148;
  Cursor local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_118;
  undefined1 local_100 [8];
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long local_d0;
  int local_c8;
  Button BStack_c4;
  atomic<int> aStack_c0;
  undefined4 uStack_bc;
  _Manager_type local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  ScreenInteractive *local_90;
  termios local_88;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters_00;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters_01;
  
  parameters_00 =
       (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
        *)local_1b8;
  parameters_01 =
       (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
        *)local_1b8;
  _uStack_1b0 = (__sighandler_t *)0x0;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
       ::_M_manager;
  local_1b8 = (undefined1  [8])this;
  local_130 = (Cursor)component;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  local_170 = this;
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  lVar11 = 0;
  do {
    local_160._0_4_ = *(int *)((long)&DAT_0015a720 + lVar11);
    local_88._0_8_ = ::signal(*(int *)((long)&DAT_0015a720 + lVar11),anon_unknown_0::OnExit);
    local_1b8 = (undefined1  [8])local_160;
    local_1a8._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
         ::_M_invoke;
    local_1a8._0_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
         ::_M_manager;
    _uStack_1b0 = &local_88;
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
    if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
    }
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x18);
  tcgetattr(0,&local_88);
  local_1a8._0_8_ = (_Manager_type)0x0;
  local_1a8._8_8_ = (_Invoker_type)0x0;
  local_1b8 = (undefined1  [8])0x0;
  _uStack_1b0 = 0;
  local_1b8 = (undefined1  [8])operator_new(0x3c);
  *(undefined8 *)local_1b8 = local_88._0_8_;
  *(ulong *)((long)local_1b8 + 8) = CONCAT44(local_88.c_lflag,local_88.c_cflag);
  *(ulong *)((long)local_1b8 + 0x10) = CONCAT26(local_88.c_cc._5_2_,local_88._16_6_);
  *(undefined8 *)((long)local_1b8 + 0x18) = local_88.c_cc._7_8_;
  *(undefined8 *)((long)local_1b8 + 0x20) = local_88.c_cc._15_8_;
  *(ulong *)((long)local_1b8 + 0x28) = CONCAT44(local_88.c_cc._27_4_,local_88.c_cc._23_4_);
  *(ulong *)((long)local_1b8 + 0x2c) = CONCAT44(local_88._48_4_,local_88.c_cc._27_4_);
  *(undefined8 *)((long)local_1b8 + 0x34) = local_88._52_8_;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  pSVar12 = local_170;
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  local_88.c_lflag = local_88.c_lflag & 0xfffffff5;
  local_88.c_cc[5] = '\0';
  local_88.c_cc[6] = '\0';
  tcsetattr(0,0,&local_88);
  uVar5 = (anonymous_namespace)::on_resize._16_8_;
  __a = std::
        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
        ::_M_invoke;
  local_1b8._0_4_ = SUB84(pSVar12,0);
  uVar6 = local_1b8._0_4_;
  local_1b8._4_4_ = (undefined4)((ulong)pSVar12 >> 0x20);
  uVar7 = local_1b8._4_4_;
  local_1b8._4_4_ = (anonymous_namespace)::on_resize._4_4_;
  local_1b8._0_4_ = (anonymous_namespace)::on_resize._0_4_;
  uStack_1ac = (anonymous_namespace)::on_resize._12_4_;
  uStack_1b0 = (anonymous_namespace)::on_resize._8_4_;
  (anonymous_namespace)::on_resize._0_4_ = uVar6;
  (anonymous_namespace)::on_resize._4_4_ = uVar7;
  (anonymous_namespace)::on_resize._8_4_ = 0;
  (anonymous_namespace)::on_resize._12_4_ = 0;
  local_1a8._0_8_ = (anonymous_namespace)::on_resize._16_8_;
  (anonymous_namespace)::on_resize._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_manager;
  local_1a8._8_8_ = (anonymous_namespace)::on_resize._24_8_;
  (anonymous_namespace)::on_resize._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_invoke;
  if (uVar5 != 0) {
    (*(code *)uVar5)(local_1b8,local_1b8,3);
  }
  local_148.
  super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_148.
                         super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x1c);
  local_160._0_8_ = ::signal(0x1c,anon_unknown_0::OnResize);
  _uStack_1b0 = local_160;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:214:26)>
       ::_M_manager;
  local_1b8 = (undefined1  [8])&local_148;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1b8,1);
  std::ostream::flush();
  local_1b8 = (undefined1  [8])0x0;
  _uStack_1b0 = 0;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  if (local_170->use_alternative_screen_ == true) {
    local_1b8._0_4_ = 0x419;
    __l._M_len = 1;
    __l._M_array = (iterator)local_1b8;
    std::
    vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              *)&local_e0,__l,(allocator_type *)__a);
    Loop::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_e0._M_local_buf,parameters_00);
    if ((void *)local_e0._M_allocated_capacity != (void *)0x0) {
      operator_delete((void *)local_e0._M_allocated_capacity,local_d0 - local_e0._0_8_);
    }
  }
  _uStack_1b0 = 0;
  local_1b8 = (undefined1  [8])local_170;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  local_168 = (undefined1  [8])&DAT_700000019;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_168;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_118,__l_00,(allocator_type *)__a);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)local_160,&local_118);
  (anonymous_namespace)::Reset_abi_cxx11_
            ((string *)local_1b8,(_anonymous_namespace_ *)local_160,parameters);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_1b8,_uStack_1b0);
  if (local_1b8 != (undefined1  [8])local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._0_8_ + 1));
  }
  if ((ReceiverImpl<ftxui::Event> *)local_160._0_8_ != (ReceiverImpl<ftxui::Event> *)0x0) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ - local_160._0_8_);
  }
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_148,&local_118);
  local_1a8._0_8_ = (_Manager_type)0x0;
  local_1a8._8_8_ = (_Invoker_type)0x0;
  local_1b8 = (undefined1  [8])0x0;
  _uStack_1b0 = 0;
  local_1b8 = (undefined1  [8])operator_new(0x18);
  __a_00 = (allocator_type *)
           local_148.
           super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(pointer *)local_1b8 =
       local_148.
       super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)local_1b8 + 8) =
       local_148.
       super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)local_1b8 + 0x10) =
       local_148.
       super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.
  super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  if ((pointer)local_148.
               super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((ReceiverImpl<ftxui::Event> *)
      local_118.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start != (ReceiverImpl<ftxui::Event> *)0x0) {
    operator_delete(local_118.
                    super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b8 = (undefined1  [8])0x3ed000003eb;
  uStack_1b0 = 0x3ee;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1b8;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_f8,__l_01,__a_00);
  Loop::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_f8,parameters_01);
  if (local_f8.
      super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1b8,1);
  std::ostream::flush();
  local_1b8 = (undefined1  [8])0x0;
  _uStack_1b0 = 0;
  local_1a8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:339:28)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)local_1b8);
  pSVar12 = local_170;
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  local_1b8 = (undefined1  [8])anon_unknown_0::EventListener;
  local_148.
  super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&pSVar12->quit_;
  local_100 = (undefined1  [8])
              local_148.
              super__Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              ._M_impl.super__Vector_impl_data._M_start;
  ReceiverImpl<ftxui::Event>::MakeSender((ReceiverImpl<ftxui::Event> *)local_168);
  std::thread::
  thread<void(*)(std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>),std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>,void>
            ((thread *)local_160,
             (_func_void_atomic<bool>_ptr_unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              **)local_1b8,(atomic<bool> **)&local_148,
             (unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              *)local_168);
  auVar8 = local_168;
  if (local_168 != (undefined1  [8])0x0) {
    LOCK();
    ((*(ReceiverImpl<ftxui::Event> **)local_168)->senders_).super___atomic_base<int>._M_i =
         ((*(ReceiverImpl<ftxui::Event> **)local_168)->senders_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    std::condition_variable::notify_one();
    operator_delete((void *)auVar8,8);
  }
  pSVar12 = local_170;
  do {
    if (((__int_type_conflict)*(__atomic_base<bool> *)local_100 & 1U) != 0) break;
    pRVar1 = (pSVar12->event_receiver_)._M_t.
             super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
             .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>._M_head_impl;
    _uStack_1b0 = _uStack_1b0 & 0xffffffffffffff00;
    local_1b8 = (undefined1  [8])pRVar1;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1b8);
    uStack_1b0._0_1_ = 1;
    pEVar2 = ((iterator *)((long)&(pRVar1->queue_).c + 0x30))->_M_cur;
    pEVar3 = ((iterator *)((long)&(pRVar1->queue_).c + 0x10))->_M_cur;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1b8);
    if (pEVar2 == pEVar3) {
      local_128._M_allocated_capacity = *(undefined8 *)local_130;
      local_128._8_8_ = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_130 + 8))->_M_pi
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count + 1;
        }
      }
      Draw(pSVar12,(Component *)&local_128);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
      Screen::ToString_abi_cxx11_((string *)local_1b8,&pSVar12->super_Screen);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_1b8,_uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(pSVar12->set_cursor_position)._M_dataplus._M_p,
                 (pSVar12->set_cursor_position)._M_string_length);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        operator_delete((void *)local_1b8,(ulong)(local_1a8._0_8_ + 1));
      }
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffffffffff00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1b8,1);
      std::ostream::flush();
      Screen::Clear(&pSVar12->super_Screen);
    }
    local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
    local_1a8._16_8_ = 0;
    local_190._M_local_buf[0] = '\0';
    local_180 = (ScreenInteractive *)0x0;
    local_1a8._8_8_ = &local_190;
    bVar9 = ReceiverImpl<ftxui::Event>::Receive
                      ((pSVar12->event_receiver_)._M_t.
                       super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>.
                       _M_head_impl,(Event *)local_1b8);
    pSVar12 = local_170;
    if (bVar9) {
      if (local_1b8._0_4_ == 2) {
        local_1a8._4_4_ = local_1a8._4_4_ - local_170->cursor_y_;
        local_1a8._0_4_ = local_1a8._0_4_ - local_170->cursor_x_;
      }
      else if (local_1b8._0_4_ == 3) {
        local_170->cursor_x_ = local_1b8._4_4_;
        local_170->cursor_y_ = uStack_1b0;
        goto LAB_0014576e;
      }
      local_180 = local_170;
      plVar4 = *(long **)local_130;
      local_b8 = (_Manager_type)local_1a8._0_8_;
      local_c8 = local_1b8._0_4_;
      BStack_c4 = local_1b8._4_4_;
      aStack_c0.super___atomic_base<int>._M_i = (__atomic_base<int>)(__atomic_base<int>)uStack_1b0;
      uStack_bc = uStack_1ac;
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_1a8._8_8_,local_1a8._16_8_ + local_1a8._8_8_);
      local_90 = local_180;
      (**(code **)(*plVar4 + 0x18))(plVar4,&local_c8);
      pSVar12 = local_170;
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
    }
LAB_0014576e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._8_8_ != &local_190) {
      operator_delete((void *)local_1a8._8_8_,
                      CONCAT71(local_190._M_allocated_capacity._1_7_,local_190._M_local_buf[0]) + 1)
      ;
    }
  } while (bVar9);
  signal = (int)local_160;
  std::thread::join();
  anon_unknown_0::OnExit(signal);
  if ((_Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
       )local_160._0_8_ == (ReceiverImpl<ftxui::Event> *)0x0) {
    return;
  }
  std::terminate();
}

Assistant:

void ScreenInteractive::Loop(Component component) {
  on_exit_functions.push([this] { ExitLoopClosure()(); });

  // Install signal handlers to restore the terminal state on exit. The default
  // signal handlers are restored on exit.
  for (int signal : {SIGTERM, SIGSEGV, SIGINT, SIGILL, SIGABRT, SIGFPE})
    install_signal_handler(signal, OnExit);

    // Save the old terminal configuration and restore it on exit.
#if defined(_WIN32)
  // Enable VT processing on stdout and stdin
  auto stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);
  auto stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  DWORD out_mode = 0;
  DWORD in_mode = 0;
  GetConsoleMode(stdout_handle, &out_mode);
  GetConsoleMode(stdin_handle, &in_mode);
  on_exit_functions.push([=] { SetConsoleMode(stdout_handle, out_mode); });
  on_exit_functions.push([=] { SetConsoleMode(stdin_handle, in_mode); });

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_virtual_terminal_processing = 0x0004;
  const int disable_newline_auto_return = 0x0008;
  out_mode |= enable_virtual_terminal_processing;
  out_mode |= disable_newline_auto_return;

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_line_input = 0x0002;
  const int enable_echo_input = 0x0004;
  const int enable_virtual_terminal_input = 0x0200;
  const int enable_window_input = 0x0008;
  in_mode &= ~enable_echo_input;
  in_mode &= ~enable_line_input;
  in_mode |= enable_virtual_terminal_input;
  in_mode |= enable_window_input;

  SetConsoleMode(stdin_handle, in_mode);
  SetConsoleMode(stdout_handle, out_mode);
#else
  struct termios terminal;
  tcgetattr(STDIN_FILENO, &terminal);
  on_exit_functions.push([=] { tcsetattr(STDIN_FILENO, TCSANOW, &terminal); });

  terminal.c_lflag &= ~ICANON;  // Non canonique terminal.
  terminal.c_lflag &= ~ECHO;    // Do not print after a key press.
  terminal.c_cc[VMIN] = 0;
  terminal.c_cc[VTIME] = 0;
  // auto oldf = fcntl(STDIN_FILENO, F_GETFL, 0);
  // fcntl(STDIN_FILENO, F_SETFL, oldf | O_NONBLOCK);
  // on_exit_functions.push([=] { fcntl(STDIN_FILENO, F_GETFL, oldf); });

  tcsetattr(STDIN_FILENO, TCSANOW, &terminal);

  // Handle resize.
  on_resize = [&] { event_sender_->Send(Event::Special({0})); };
  install_signal_handler(SIGWINCH, OnResize);
#endif

  // Commit state:
  auto flush = [&] {
    Flush();
    on_exit_functions.push([] { Flush(); });
  };

  auto enable = [&](std::vector<DECMode> parameters) {
    std::cout << Set(parameters);
    on_exit_functions.push([=] { std::cout << Reset(parameters); });
  };

  auto disable = [&](std::vector<DECMode> parameters) {
    std::cout << Reset(parameters);
    on_exit_functions.push([=] { std::cout << Set(parameters); });
  };

  flush();

  if (use_alternative_screen_) {
    enable({
        DECMode::kAlternateScreen,
    });
  }

  // On exit, reset cursor one line after the current drawing.
  on_exit_functions.push(
      [this] { std::cout << reset_cursor_position << std::endl; });

  disable({
      DECMode::kCursor,
      DECMode::kLineWrap,
  });

  enable({
      // DECMode::kMouseVt200,
      DECMode::kMouseAnyEvent,
      DECMode::kMouseUtf8,
      DECMode::kMouseSgrExtMode,
  });

  flush();

  auto event_listener =
      std::thread(&EventListener, &quit_, event_receiver_->MakeSender());

  // The main loop.
  while (!quit_) {
    if (!event_receiver_->HasPending()) {
      Draw(component);
      std::cout << ToString() << set_cursor_position;
      Flush();
      Clear();
    }

    Event event;
    if (!event_receiver_->Receive(&event))
      break;

    if (event.is_cursor_reporting()) {
      cursor_x_ = event.cursor_x();
      cursor_y_ = event.cursor_y();
      continue;
    }

    if (event.is_mouse()) {
      event.mouse().x -= cursor_x_;
      event.mouse().y -= cursor_y_;
    }

    event.screen_ = this;
    component->OnEvent(event);
  }

  event_listener.join();
  OnExit(0);
}